

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool apply_paint(render_state_t *state,render_context_t *context,paint_t *paint)

{
  paint_type_t pVar1;
  plutovg_spread_method_t units_00;
  units_type_t units_01;
  _Bool _Var2;
  element_t *peVar3;
  element_t *peVar4;
  element_t *peVar5;
  int iVar6;
  plutovg_canvas_t *canvas;
  element_t *peVar7;
  bool bVar8;
  float fVar9;
  float fVar10;
  float fy;
  undefined4 uVar15;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  plutovg_spread_method_t spread;
  element_t *local_600;
  float local_5f4;
  units_type_t units;
  length_type_t lStack_5ec;
  length_t fx;
  length_t x2;
  plutovg_spread_method_t spread_1;
  length_t y1;
  length_t x1;
  undefined1 local_5a8 [16];
  element_t *local_598;
  element_t *peStack_590;
  element_t *local_588;
  element_t *peStack_580;
  element_t *local_578;
  element_t *peStack_570;
  element_t *local_568;
  plutovg_matrix_t transform;
  gradient_stop_array_t stops;
  
  pVar1 = paint->type;
  if (pVar1 == paint_type_none) {
    return false;
  }
  if (pVar1 == paint_type_var) {
    if ((context->palette_func == (plutosvg_palette_func_t)0x0) ||
       (_Var2 = (*context->palette_func)
                          (context->closure,(paint->id).data,(int)(paint->id).length,
                           (plutovg_color_t *)&stops), !_Var2)) {
      stops.data[0]._0_16_ = resolve_color(context,state->element,&paint->color);
    }
    canvas = context->canvas;
  }
  else {
    if ((pVar1 != paint_type_color) &&
       (peVar3 = find_element(context->document,&paint->id), peVar3 != (element_t *)0x0)) {
      uVar15 = (undefined4)((ulong)peVar3 >> 0x20);
      if (peVar3->id == 0xc) {
        local_578 = (element_t *)0x0;
        peStack_570 = (element_t *)0x0;
        local_588 = (element_t *)0x0;
        peStack_580 = (element_t *)0x0;
        local_598 = (element_t *)0x0;
        peStack_590 = (element_t *)0x0;
        local_568 = (element_t *)0x0;
        local_5a8 = ZEXT816(0);
        iVar6 = 0x80;
        peVar4 = peVar3;
        while (bVar8 = iVar6 != 0, iVar6 = iVar6 + -1, bVar8) {
          collect_gradient_attributes(peVar4,(gradient_attributes_t *)local_5a8);
          if (peVar4->id == 0xc) {
            if ((local_588 == (element_t *)0x0) && (_Var2 = has_attribute(peVar4,5), _Var2)) {
              local_588 = peVar4;
            }
            if ((peStack_580 == (element_t *)0x0) && (_Var2 = has_attribute(peVar4,6), _Var2)) {
              peStack_580 = peVar4;
            }
            if ((local_578 == (element_t *)0x0) && (_Var2 = has_attribute(peVar4,0x17), _Var2)) {
              local_578 = peVar4;
            }
            if ((peStack_570 == (element_t *)0x0) && (_Var2 = has_attribute(peVar4,0xc), _Var2)) {
              peStack_570 = peVar4;
            }
            if ((local_568 == (element_t *)0x0) && (_Var2 = has_attribute(peVar4,0xd), _Var2)) {
              local_568 = peVar4;
            }
          }
          peVar4 = resolve_href(context->document,peVar4);
          if ((peVar4 == (element_t *)0x0) || ((peVar4->id | 4U) != 0xc)) break;
        }
        bVar8 = peStack_590 != (element_t *)0x0;
        if (bVar8) {
          auVar13._0_4_ = -(uint)(local_5a8._0_4_ == 0);
          auVar13._4_4_ = -(uint)(local_5a8._4_4_ == 0);
          auVar13._8_4_ = -(uint)(local_5a8._8_4_ == 0);
          auVar13._12_4_ = -(uint)(local_5a8._12_4_ == 0);
          auVar17._4_4_ = auVar13._0_4_;
          auVar17._0_4_ = auVar13._4_4_;
          auVar17._8_4_ = auVar13._12_4_;
          auVar17._12_4_ = auVar13._8_4_;
          auVar14._8_4_ = (int)peVar3;
          auVar14._0_8_ = peVar3;
          auVar14._12_4_ = uVar15;
          local_5a8 = ~(auVar17 & auVar13) & local_5a8 | auVar14 & auVar17 & auVar13;
          if (local_598 == (element_t *)0x0) {
            local_598 = peVar3;
          }
          peVar4 = local_588;
          if (local_588 == (element_t *)0x0) {
            peVar4 = peVar3;
          }
          peVar7 = peStack_580;
          if (peStack_580 == (element_t *)0x0) {
            peVar7 = peVar3;
          }
          peVar5 = local_578;
          if (local_578 == (element_t *)0x0) {
            peVar5 = peVar3;
          }
          spread = PLUTOVG_SPREAD_METHOD_PAD;
          spread_1 = PLUTOVG_SPREAD_METHOD_PAD;
          transform.a = 1.0;
          transform.b = 0.0;
          transform.c = 0.0;
          transform.d = 1.0;
          transform.e = 0.0;
          transform.f = 0.0;
          local_588 = peVar4;
          peStack_580 = peVar7;
          local_578 = peVar5;
          memset(&stops,0,0x508);
          resolve_gradient_attributes
                    (context,state,(gradient_attributes_t *)local_5a8,&spread,&spread_1,&transform,
                     &stops);
          x1.value = 50.0;
          x1.type = length_type_percent;
          y1.value = 50.0;
          y1.type = length_type_percent;
          x2.value = 50.0;
          x2.type = length_type_percent;
          fx.value = 50.0;
          fx.type = length_type_percent;
          units = 0x42480000;
          lStack_5ec = length_type_percent;
          parse_length(peVar4,5,&x1,true,false);
          local_600 = peVar7;
          parse_length(peVar7,6,&y1,true,false);
          parse_length(peVar5,0x17,&x2,false,false);
          if (peStack_570 == (element_t *)0x0) {
            iVar6 = 5;
          }
          else {
            iVar6 = 0xc;
            peVar4 = peStack_570;
          }
          parse_length(peVar4,iVar6,&fx,true,false);
          if (local_568 == (element_t *)0x0) {
            iVar6 = 6;
            peVar3 = local_600;
          }
          else {
            iVar6 = 0xd;
            peVar3 = local_568;
          }
          parse_length(peVar3,iVar6,(length_t *)&units,true,false);
          units_00 = spread;
          fVar9 = resolve_gradient_length(state,&x1,spread,'x');
          local_600 = (element_t *)CONCAT44(local_600._4_4_,fVar9);
          fVar9 = resolve_gradient_length(state,&y1,units_00,'y');
          local_5f4 = resolve_gradient_length(state,&x2,units_00,'o');
          fVar10 = resolve_gradient_length(state,&fx,units_00,'x');
          fy = resolve_gradient_length(state,(length_t *)&units,units_00,'y');
          plutovg_canvas_set_radial_gradient
                    (context->canvas,local_600._0_4_,fVar9,local_5f4,fVar10,fy,0.0,spread_1,
                     stops.data,(int)stops.size,&transform);
          return bVar8;
        }
        return bVar8;
      }
      if (peVar3->id != 8) {
        return false;
      }
      local_578 = (element_t *)0x0;
      peStack_570 = (element_t *)0x0;
      local_588 = (element_t *)0x0;
      peStack_580 = (element_t *)0x0;
      local_598 = (element_t *)0x0;
      peStack_590 = (element_t *)0x0;
      local_5a8 = ZEXT816(0);
      iVar6 = 0x80;
      peVar4 = peVar3;
      while( true ) {
        bVar8 = iVar6 == 0;
        iVar6 = iVar6 + -1;
        if (bVar8) break;
        collect_gradient_attributes(peVar4,(gradient_attributes_t *)local_5a8);
        if (peVar4->id == 8) {
          if ((local_588 == (element_t *)0x0) && (_Var2 = has_attribute(peVar4,0x2b), _Var2)) {
            local_588 = peVar4;
          }
          if ((peStack_580 == (element_t *)0x0) && (_Var2 = has_attribute(peVar4,0x2e), _Var2)) {
            peStack_580 = peVar4;
          }
          if ((local_578 == (element_t *)0x0) && (_Var2 = has_attribute(peVar4,0x2c), _Var2)) {
            local_578 = peVar4;
          }
          if ((peStack_570 == (element_t *)0x0) && (_Var2 = has_attribute(peVar4,0x2f), _Var2)) {
            peStack_570 = peVar4;
          }
        }
        peVar4 = resolve_href(context->document,peVar4);
        if ((peVar4 == (element_t *)0x0) || ((peVar4->id | 4U) != 0xc)) break;
      }
      bVar8 = peStack_590 != (element_t *)0x0;
      if (bVar8) {
        auVar11._0_4_ = -(uint)(local_5a8._0_4_ == 0);
        auVar11._4_4_ = -(uint)(local_5a8._4_4_ == 0);
        auVar11._8_4_ = -(uint)(local_5a8._8_4_ == 0);
        auVar11._12_4_ = -(uint)(local_5a8._12_4_ == 0);
        auVar16._4_4_ = auVar11._0_4_;
        auVar16._0_4_ = auVar11._4_4_;
        auVar16._8_4_ = auVar11._12_4_;
        auVar16._12_4_ = auVar11._8_4_;
        auVar12._8_4_ = (int)peVar3;
        auVar12._0_8_ = peVar3;
        auVar12._12_4_ = uVar15;
        local_5a8 = ~(auVar16 & auVar11) & local_5a8 | auVar12 & auVar16 & auVar11;
        if (local_598 == (element_t *)0x0) {
          local_598 = peVar3;
        }
        peVar4 = local_588;
        if (local_588 == (element_t *)0x0) {
          peVar4 = peVar3;
        }
        peVar7 = peStack_580;
        if (peStack_580 == (element_t *)0x0) {
          peVar7 = peVar3;
        }
        local_600 = local_578;
        if (local_578 == (element_t *)0x0) {
          local_600 = peVar3;
        }
        peVar5 = peStack_570;
        if (peStack_570 == (element_t *)0x0) {
          peVar5 = peVar3;
        }
        _units = (length_t)((ulong)lStack_5ec << 0x20);
        spread = PLUTOVG_SPREAD_METHOD_PAD;
        transform.a = 1.0;
        transform.b = 0.0;
        transform.c = 0.0;
        transform.d = 1.0;
        transform.e = 0.0;
        transform.f = 0.0;
        local_588 = peVar4;
        peStack_580 = peVar7;
        local_578 = local_600;
        peStack_570 = peVar5;
        memset(&stops,0,0x508);
        resolve_gradient_attributes
                  (context,state,(gradient_attributes_t *)local_5a8,&units,&spread,&transform,&stops
                  );
        x1.value = 0.0;
        x1.type = length_type_fixed;
        y1.value = 0.0;
        y1.type = length_type_fixed;
        x2.value = 100.0;
        x2.type = length_type_percent;
        fx.value = 0.0;
        fx.type = length_type_fixed;
        parse_length(peVar4,0x2b,&x1,true,false);
        parse_length(peVar7,0x2e,&y1,true,false);
        parse_length(local_600,0x2c,&x2,true,false);
        parse_length(peVar5,0x2f,&fx,true,false);
        units_01 = units;
        fVar9 = resolve_gradient_length(state,&x1,units,'x');
        local_600 = (element_t *)CONCAT44(local_600._4_4_,fVar9);
        fVar9 = resolve_gradient_length(state,&y1,units_01,'y');
        local_5f4 = resolve_gradient_length(state,&x2,units_01,'x');
        fVar10 = resolve_gradient_length(state,&fx,units_01,'y');
        plutovg_canvas_set_linear_gradient
                  (context->canvas,local_600._0_4_,fVar9,local_5f4,fVar10,spread,stops.data,
                   (int)stops.size,&transform);
        return bVar8;
      }
      return bVar8;
    }
    stops.data[0]._0_16_ = resolve_color(context,state->element,&paint->color);
    canvas = context->canvas;
  }
  plutovg_canvas_set_color(canvas,(plutovg_color_t *)&stops);
  return true;
}

Assistant:

static bool apply_paint(render_state_t* state, const render_context_t* context, const paint_t* paint)
{
    if(paint->type == paint_type_none)
        return false;
    if(paint->type == paint_type_color) {
        plutovg_color_t color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    if(paint->type == paint_type_var) {
        plutovg_color_t color;
        if(!context->palette_func || !context->palette_func(context->closure, paint->id.data, paint->id.length, &color))
            color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    const element_t* ref = find_element(context->document, &paint->id);
    if(ref == NULL) {
        plutovg_color_t color = resolve_color(context, state->element, &paint->color);
        plutovg_canvas_set_color(context->canvas, &color);
        return true;
    }

    if(ref->id == TAG_LINEAR_GRADIENT)
        return apply_linear_gradient(state, context, ref);
    if(ref->id == TAG_RADIAL_GRADIENT)
        return apply_radial_gradient(state, context, ref);
    return false;
}